

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O3

void Aig_ManPackAddPattern(Aig_ManPack_t *p,Vec_Int_t *vLits)

{
  int iVar1;
  int k;
  int iBit;
  
  iBit = 1;
  do {
    iVar1 = Aig_ManPackAddPatternTry(p,iBit,vLits);
    if (iVar1 != 0) goto LAB_0060a454;
    iBit = iBit + 1;
  } while (iBit != 0x40);
  p->nPatSkip = p->nPatSkip + 1;
LAB_0060a454:
  p->nPatTotal = p->nPatTotal + 1;
  return;
}

Assistant:

void Aig_ManPackAddPattern( Aig_ManPack_t * p, Vec_Int_t * vLits )
{
    int k;
    for ( k = 1; k < 64; k++ )
        if ( Aig_ManPackAddPatternTry( p, k, vLits ) )
            break;
    if ( k == 64 )
    {
/*
        word * pInfo, * pPres;
        int i, Lit;
        Vec_IntForEachEntry( vLits, Lit, i )
            printf( "%d", Abc_LitIsCompl(Lit) );
        printf( "\n\n" );
        for ( k = 1; k < 64; k++ )
        {
            Vec_IntForEachEntry( vLits, Lit, i )
            {
                pInfo = Vec_WrdEntryP( p->vPiPats, Abc_Lit2Var(Lit) );
                pPres = Vec_WrdEntryP( p->vPiCare, Abc_Lit2Var(Lit) );
                if ( Abc_InfoHasBit( (unsigned *)pPres, k ) )
                    printf( "%d", Abc_InfoHasBit( (unsigned *)pInfo, k ) );
                else
                    printf( "-" );
            }
            printf( "\n" );
        }
*/
        p->nPatSkip++;
    }
    p->nPatTotal++;
}